

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O1

void operator_delete(void *p,nothrow_t *param_2)

{
  undefined1 *puVar1;
  PagemapEntry *entry;
  unsigned_short *puVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  ulong uVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  code *pcVar7;
  address_t n;
  BackendSlabMetadata *meta;
  address_t c_1;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  address_t c;
  undefined8 *in_FS_OFFSET;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar8 = (ulong)p >> 10 & 0xfffffffffffffff0;
  entry = (PagemapEntry *)
          ((long)&((snmalloc::
                    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                    ::concretePagemap.body)->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta + uVar8);
  uVar8 = *(ulong *)((long)&((snmalloc::
                              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar8);
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
      (uVar8 & 0xffffffffffffff80)) {
    uVar8 = (ulong)(((uint)uVar8 & 0x7f) << 5);
    if ((*(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 8) & (ulong)p) *
        *(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 0x18) <
        *(ulong *)(snmalloc::sizeclass_metadata + uVar8 + 0x18)) {
      uVar8 = (entry->
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              ).super_MetaEntryBase.meta;
      meta = (BackendSlabMetadata *)(uVar8 & 0xfffffffffffffffe);
      uVar8 = uVar8 >> 3;
      uVar3 = (this->entropy).bit_source;
      uVar6 = uVar3 >> 1;
      (this->entropy).bit_source = uVar6 | (ulong)((uVar3 & 1) != 0) << 0x3f;
      uVar10 = (uint)uVar6 & 1;
      ppvVar4 = (meta->
                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ).free_queue.end._M_elems[uVar10];
      *(address_t *)((long)p + 8) =
           ((snmalloc::freelist::Object::key_root.key2 ^ uVar8) + (long)p) *
           (snmalloc::freelist::Object::key_root.key1 + (long)ppvVar4);
      *ppvVar4 = (void *)(snmalloc::freelist::Object::key_root.key_next ^ (ulong)p ^ uVar8);
      (meta->
      super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
      ).free_queue.end._M_elems[uVar10] = (void **)p;
      puVar2 = (meta->
               super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
               ).free_queue.length._M_elems + uVar10;
      *puVar2 = *puVar2 + 1;
      puVar1 = &(meta->
                super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                ).free_queue.field_0x24;
      *(short *)puVar1 = *(short *)puVar1 + -1;
      if (*(short *)puVar1 != 0) {
        return;
      }
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if ((undefined1 *)(uVar8 & 0xffffffffffffff80) == (undefined1 *)0x0) {
    if (p == (void *)0x0) {
      return;
    }
  }
  else if (-1 < (char)uVar8) {
    lVar5 = (this->remote_dealloc_cache).capacity;
    lVar9 = lVar5 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5));
    if (lVar9 == 0 || lVar5 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5)))
    {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar9;
    if (p == (void *)0x0) {
      p = (void **)0x0;
    }
    else {
      *(undefined8 *)p = 0;
      *(undefined8 *)((long)p + 8) = 0;
    }
    uVar8 = *(ulong *)((long)&((snmalloc::
                                BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                ::concretePagemap.body)->
                              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                              ).super_MetaEntryBase.remote_and_sizeclass +
                      ((ulong)p >> 10 & 0xfffffffffffffff0));
    if ((void **)p == (void **)0x0) {
      p = (void **)0x0;
    }
    else {
      *(void **)p = (void *)0x0;
      *(void **)((long)p + 8) = (void *)0x0;
    }
    uVar8 = uVar8 >> 0xe & 0xff;
    ppvVar4 = (this->remote_dealloc_cache).list._M_elems[uVar8].end._M_elems[0];
    *(void **)((long)p + 8) =
         (void *)((snmalloc::RemoteAllocator::key_global.key2 + (long)p) *
                 (snmalloc::RemoteAllocator::key_global.key1 + (long)ppvVar4));
    *ppvVar4 = (void *)(snmalloc::RemoteAllocator::key_global.key_next ^ (ulong)p);
    (this->remote_dealloc_cache).list._M_elems[uVar8].end._M_elems[0] = (void **)p;
    return;
  }
  pcVar7 = (code *)invalidInstructionException();
  (*pcVar7)();
}

Assistant:

void operator delete(void* p, std::nothrow_t&)
{
  snmalloc::libc::free(p);
}